

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::ExtensionRangeOptions>
          (ParseContext *this,ExtensionRangeOptions *msg,char *ptr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [12];
  char *pcVar5;
  uint uVar6;
  pair<const_char_*,_int> pVar7;
  
  bVar1 = *ptr;
  if ((char)bVar1 < '\0') {
    pVar7 = ReadSizeFallback(ptr,(uint)bVar1);
    auVar4 = pVar7._0_12_;
    if (pVar7.first == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    auVar4[8] = bVar1;
    auVar4._0_8_ = ptr + 1;
    auVar4._9_3_ = 0;
  }
  pcVar5 = (this->super_EpsCopyInputStream).buffer_end_;
  uVar6 = (auVar4._0_4_ - (int)pcVar5) + auVar4._8_4_;
  (this->super_EpsCopyInputStream).limit_end_ = pcVar5 + (int)((int)uVar6 >> 0x1f & uVar6);
  iVar2 = (this->super_EpsCopyInputStream).limit_;
  (this->super_EpsCopyInputStream).limit_ = uVar6;
  iVar3 = this->depth_;
  this->depth_ = iVar3 + -1;
  if (((0 < iVar3) &&
      (pcVar5 = ExtensionRangeOptions::_InternalParse(msg,auVar4._0_8_,this), pcVar5 != (char *)0x0)
      ) && (this->depth_ = this->depth_ + 1, (this->super_EpsCopyInputStream).last_tag_minus_1_ == 0
           )) {
    uVar6 = (iVar2 - uVar6) + (this->super_EpsCopyInputStream).limit_;
    (this->super_EpsCopyInputStream).limit_ = uVar6;
    (this->super_EpsCopyInputStream).limit_end_ =
         (this->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar6 >> 0x1f & uVar6);
    return pcVar5;
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}